

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

spv_result_t __thiscall
anon_unknown.dwarf_3d4dca::Parser::exhaustedInputDiagnostic
          (Parser *this,size_t inst_offset,Op opcode,spv_operand_type_t type)

{
  char *pcVar1;
  DiagnosticStream local_200;
  
  diagnostic(&local_200,this);
  std::operator<<((ostream *)&local_200,"End of input reached while decoding Op");
  pcVar1 = spvOpcodeString(opcode);
  std::operator<<((ostream *)&local_200,pcVar1);
  std::operator<<((ostream *)&local_200," starting at word ");
  std::ostream::_M_insert<unsigned_long>((ulong)&local_200);
  pcVar1 = ": missing ";
  if ((this->_).word_index < (this->_).num_words) {
    pcVar1 = ": truncated ";
  }
  std::operator<<((ostream *)&local_200,pcVar1);
  pcVar1 = spvOperandTypeStr(type);
  std::operator<<((ostream *)&local_200,pcVar1);
  std::operator<<((ostream *)&local_200," operand at word offset ");
  std::ostream::_M_insert<unsigned_long>((ulong)&local_200);
  std::operator<<((ostream *)&local_200,".");
  spvtools::DiagnosticStream::~DiagnosticStream(&local_200);
  return local_200.error_;
}

Assistant:

spv_result_t exhaustedInputDiagnostic(size_t inst_offset, spv::Op opcode,
                                        spv_operand_type_t type) {
    return diagnostic() << "End of input reached while decoding Op"
                        << spvOpcodeString(opcode) << " starting at word "
                        << inst_offset
                        << ((_.word_index < _.num_words) ? ": truncated "
                                                         : ": missing ")
                        << spvOperandTypeStr(type) << " operand at word offset "
                        << _.word_index - inst_offset << ".";
  }